

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setMaxCount(QComboBox *this,int max)

{
  int iVar1;
  QComboBoxPrivate *pQVar2;
  uint in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  int rowCount;
  QComboBoxPrivate *d;
  char *in_stack_ffffffffffffff88;
  QAbstractItemModel *pQVar3;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QPersistentModelIndex local_40 [3];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QComboBox *)0x5379ae);
  if ((int)in_ESI < 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_RDI,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    QMessageLogger::warning
              (local_28,"QComboBox::setMaxCount: Invalid count (%d) must be >= 0",(ulong)in_ESI);
  }
  else {
    iVar1 = count((QComboBox *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if ((int)in_ESI < iVar1) {
      pQVar3 = pQVar2->model;
      iVar1 = iVar1 - in_ESI;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_40);
      (**(code **)(*(long *)pQVar3 + 0x108))(pQVar3,in_ESI,iVar1,local_40);
    }
    pQVar2->maxCount = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setMaxCount(int max)
{
    Q_D(QComboBox);
    if (Q_UNLIKELY(max < 0)) {
        qWarning("QComboBox::setMaxCount: Invalid count (%d) must be >= 0", max);
        return;
    }

    const int rowCount = count();
    if (rowCount > max)
        d->model->removeRows(max, rowCount - max, d->root);

    d->maxCount = max;
}